

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O3

int send_flow(SESSION_INSTANCE *session)

{
  int iVar1;
  int extraout_EAX;
  FLOW_HANDLE in_RAX;
  AMQP_VALUE performative;
  
  if (session != (SESSION_INSTANCE *)0x0) {
    in_RAX = flow_create(session->incoming_window,session->next_outgoing_id,session->outgoing_window
                        );
    if (in_RAX != (FLOW_HANDLE)0x0) {
      iVar1 = flow_set_next_incoming_id(in_RAX,session->next_incoming_id);
      if (iVar1 == 0) {
        performative = amqpvalue_create_flow(in_RAX);
        if (performative != (AMQP_VALUE)0x0) {
          connection_encode_frame
                    (session->endpoint,performative,(PAYLOAD *)0x0,0,(ON_SEND_COMPLETE)0x0,
                     (void *)0x0);
          amqpvalue_destroy(performative);
        }
      }
      flow_destroy(in_RAX);
      return extraout_EAX;
    }
  }
  return (int)in_RAX;
}

Assistant:

static int send_flow(SESSION_INSTANCE* session)
{
    int result;
    if (session == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        FLOW_HANDLE flow = flow_create(session->incoming_window, session->next_outgoing_id, session->outgoing_window);

        if (flow == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (flow_set_next_incoming_id(flow, session->next_incoming_id) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE flow_performative_value = amqpvalue_create_flow(flow);
                if (flow_performative_value == NULL)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    if (connection_encode_frame(session->endpoint, flow_performative_value, NULL, 0, NULL, NULL) != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }

                    amqpvalue_destroy(flow_performative_value);
                }
            }

            flow_destroy(flow);
        }
    }

    return result;
}